

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

FxExpression * __thiscall FxSelf::Resolve(FxSelf *this,FCompileContext *ctx)

{
  Variant *pVVar1;
  PPointer *pPVar2;
  FCompileContext *ctx_local;
  FxSelf *this_local;
  
  this_local = this;
  if (((this->super_FxExpression).isresolved & 1U) == 0) {
    (this->super_FxExpression).isresolved = true;
    if ((ctx->Function == (PFunction *)0x0) ||
       (pVVar1 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                           (&ctx->Function->Variants,0), pVVar1->SelfClass == (PStruct *)0x0)) {
      FScriptPosition::Message
                (&(this->super_FxExpression).ScriptPosition,2,
                 "self used outside of a member function");
      if (this != (FxSelf *)0x0) {
        (*(this->super_FxExpression)._vptr_FxExpression[1])();
      }
      this_local = (FxSelf *)0x0;
    }
    else {
      pVVar1 = TArray<PFunction::Variant,_PFunction::Variant>::operator[]
                         (&ctx->Function->Variants,0);
      pPVar2 = NewPointer((PType *)pVVar1->SelfClass,false);
      (this->super_FxExpression).ValueType = (PType *)pPVar2;
    }
  }
  return &this_local->super_FxExpression;
}

Assistant:

FxExpression *FxSelf::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	if (ctx.Function == nullptr || ctx.Function->Variants[0].SelfClass == nullptr)
	{
		ScriptPosition.Message(MSG_ERROR, "self used outside of a member function");
		delete this;
		return nullptr;
	}
	ValueType = NewPointer(ctx.Function->Variants[0].SelfClass);
	return this;
}